

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void f_parser(lua_State *L,void *ud)

{
  StkId pTVar1;
  global_State *pgVar2;
  GCObject *pGVar3;
  UpVal *pUVar4;
  TValue *i_o;
  SParser *p;
  Closure *cl;
  Proto *tf;
  int i;
  void *ud_local;
  lua_State *L_local;
  
  if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
    luaC_step(L);
  }
  pgVar2 = (global_State *)luaY_parser(L,*ud,(Mbuffer *)((long)ud + 8),*(char **)((long)ud + 0x20));
  pGVar3 = (GCObject *)luaF_newLclosure(L,(uint)(byte)pgVar2->GCthreshold,&((L->l_gt).value.gc)->h);
  (pGVar3->th).l_G = pgVar2;
  for (tf._4_4_ = 0; tf._4_4_ < (int)(uint)(byte)pgVar2->GCthreshold; tf._4_4_ = tf._4_4_ + 1) {
    pUVar4 = luaF_newupval(L);
    *(UpVal **)((long)pGVar3 + (long)tf._4_4_ * 8 + 0x28) = pUVar4;
  }
  pTVar1 = L->top;
  (pTVar1->value).gc = pGVar3;
  pTVar1->tt = 6;
  if ((long)L->stack_last - (long)L->top < 0x11) {
    luaD_growstack(L,1);
  }
  L->top = L->top + 1;
  return;
}

Assistant:

static void f_parser(lua_State*L,void*ud){
int i;
Proto*tf;
Closure*cl;
struct SParser*p=cast(struct SParser*,ud);
luaC_checkGC(L);
tf=luaY_parser(L,p->z,
&p->buff,p->name);
cl=luaF_newLclosure(L,tf->nups,hvalue(gt(L)));
cl->l.p=tf;
for(i=0;i<tf->nups;i++)
cl->l.upvals[i]=luaF_newupval(L);
setclvalue(L,L->top,cl);
incr_top(L);
}